

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O3

void Aig_MmStepStop(Aig_MmStep_t *p,int fVerbose)

{
  int iVar1;
  long lVar2;
  
  if (0 < p->nMems) {
    lVar2 = 0;
    do {
      Aig_MmFixedStop(p->pMems[lVar2],fVerbose);
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nMems);
  }
  if (p->nChunksAlloc != 0) {
    iVar1 = p->nChunks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->pChunks[lVar2] != (char *)0x0) {
          free(p->pChunks[lVar2]);
          p->pChunks[lVar2] = (char *)0x0;
          iVar1 = p->nChunks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
  }
  if (p->pMems != (Aig_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Aig_MmFixed_t **)0x0;
  }
  if (p->pMap != (Aig_MmFixed_t **)0x0) {
    free(p->pMap);
  }
  free(p);
  return;
}

Assistant:

void Aig_MmStepStop( Aig_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Aig_MmFixedStop( p->pMems[i], fVerbose );
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        ABC_FREE( p->pChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}